

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void b_trapped(char *item,int bodypart)

{
  xchar xVar1;
  int n;
  char *pcVar2;
  uint uVar3;
  
  xVar1 = level_difficulty(&u.uz);
  uVar3 = ((uint)(int)xVar1 >> 1) + 2;
  if (xVar1 < '\x05') {
    uVar3 = (int)xVar1;
  }
  n = rnd(uVar3 + 5);
  pcVar2 = The(item);
  pline("KABOOM!!  %s was booby-trapped!",pcVar2);
  wake_nearby();
  losehp(n,"explosion",0);
  exercise(0,'\0');
  if (bodypart != 0) {
    exercise(4,'\0');
  }
  make_stunned((ulong)(u.uprops[0x1b].intrinsic + n),'\x01');
  return;
}

Assistant:

void b_trapped(const char *item, int bodypart)
{
	int lvl = level_difficulty(&u.uz);
	int dmg = rnd(5 + (lvl < 5 ? lvl : 2+lvl/2));

	pline("KABOOM!!  %s was booby-trapped!", The(item));
	wake_nearby();
	losehp(dmg, "explosion", KILLED_BY_AN);
	exercise(A_STR, FALSE);
	if (bodypart) exercise(A_CON, FALSE);
	make_stunned(HStun + dmg, TRUE);
}